

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O2

void __thiscall PGSStreamReader::yuvToRgb(PGSStreamReader *this,int minY)

{
  ushort uVar1;
  ushort uVar2;
  RGBQUAD RVar3;
  _Base_ptr p_Var4;
  RGBQUAD *pRVar5;
  byte *pbVar6;
  RGBQUAD *pRVar7;
  byte *pbVar8;
  RGBQUAD zeroRgb;
  YUVQuad yuvPal [256];
  undefined1 local_844 [4];
  undefined1 local_840;
  int local_83c;
  byte local_838 [1024];
  RGBQUAD local_438 [258];
  
  pbVar8 = this->m_imgBuffer;
  pRVar7 = (RGBQUAD *)this->m_rgbBuffer;
  uVar1 = this->m_video_width;
  uVar2 = this->m_video_height;
  local_83c = minY;
  memset(local_838,0,0x400);
  memset(local_438,0,0x400);
  for (p_Var4 = (this->m_palette)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->m_palette)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    local_840 = p_Var4[1].field_0x4;
    local_844 = (undefined1  [4])p_Var4[1]._M_color;
    RVar3 = text_subtitles::TextToPGSConverter::YUVAToRGBA((YUVQuad *)(local_844 + 1));
    local_438[local_844[0]] = RVar3;
    *(uint *)(local_838 + (ulong)local_844[0] * 4) = CONCAT13(local_840,local_844._1_3_);
  }
  pbVar6 = pbVar8 + (ulong)uVar2 * (ulong)uVar1;
  local_844[0] = '\0';
  local_844[1] = '\0';
  local_844[2] = '\0';
  local_844[3] = '\0';
  for (; pbVar8 < pbVar6; pbVar8 = pbVar8 + 1) {
    pRVar5 = local_438 + *pbVar8;
    if ((int)(uint)local_838[(ulong)*pbVar8 * 4] < local_83c) {
      pRVar5 = (RGBQUAD *)local_844;
    }
    *pRVar7 = *pRVar5;
    pRVar7 = pRVar7 + 1;
  }
  return;
}

Assistant:

void PGSStreamReader::yuvToRgb(const int minY) const
{
    const uint8_t* src = m_imgBuffer;
    const int size = m_video_width * m_video_height;
    const uint8_t* end = src + size;
    auto dst = reinterpret_cast<RGBQUAD*>(m_rgbBuffer);

    RGBQUAD rgbPal[256]{};
    YUVQuad yuvPal[256];
    memset(&rgbPal[0], 0, sizeof(rgbPal));
    memset(&rgbPal[0], 0, sizeof(yuvPal));

    for (auto itr : m_palette)
    {
        rgbPal[itr.first] = TextToPGSConverter::YUVAToRGBA(itr.second);
        yuvPal[itr.first] = itr.second;
    }
    constexpr RGBQUAD zeroRgb = {};
    for (; src < end; ++src)
    {
        if (yuvPal[*src].Y >= minY)
            *dst++ = rgbPal[*src];
        else
            *dst++ = zeroRgb;
    }
}